

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuadrature.cpp
# Opt level: O3

void __thiscall chrono::ChQuadratureTables::PrintTables(ChQuadratureTables *this)

{
  pointer pvVar1;
  bool bVar2;
  ChLog *pCVar3;
  ChStreamOutAscii *pCVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  pCVar3 = GetLog();
  ChStreamOutAscii::operator<<(&pCVar3->super_ChStreamOutAscii,"PrintTables: \n\n");
  if ((this->Lroots).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->Lroots).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      pCVar3 = GetLog();
      pCVar4 = ChStreamOutAscii::operator<<(&pCVar3->super_ChStreamOutAscii,"\nOrder: ");
      pvVar1 = (this->Lroots).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar4 = ChStreamOutAscii::operator<<
                         (pCVar4,(long)*(pointer *)
                                        ((long)&pvVar1[uVar7].
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data + 8) -
                                 *(long *)&pvVar1[uVar7].
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data >> 3);
      pCVar4 = ChStreamOutAscii::operator<<(pCVar4,"  at table n.");
      pCVar4 = ChStreamOutAscii::operator<<(pCVar4,(uint)uVar7);
      ChStreamOutAscii::operator<<(pCVar4," with roots&weights: \n");
      pvVar1 = (this->Lroots).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar1[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data + 8) !=
          pvVar1[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar5 = 0;
        uVar6 = 1;
        do {
          pCVar3 = GetLog();
          pCVar4 = ChStreamOutAscii::operator<<(&pCVar3->super_ChStreamOutAscii,"  ");
          ChStreamOutAscii::operator<<
                    (pCVar4,*(double *)
                             (*(long *)&(this->Lroots).
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar7].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data + uVar5 * 8));
          pvVar1 = (this->Lroots).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          bVar2 = uVar6 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar1[uVar7].
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  *(long *)&pvVar1[uVar7].
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data >> 3);
          uVar5 = uVar6;
          uVar6 = (ulong)((int)uVar6 + 1);
        } while (bVar2);
      }
      pCVar3 = GetLog();
      ChStreamOutAscii::operator<<(&pCVar3->super_ChStreamOutAscii,"\n");
      pvVar1 = (this->Weight).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar1[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl + 8) !=
          *(pointer *)&pvVar1[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl) {
        uVar5 = 0;
        uVar6 = 1;
        do {
          pCVar3 = GetLog();
          pCVar4 = ChStreamOutAscii::operator<<(&pCVar3->super_ChStreamOutAscii,"  ");
          ChStreamOutAscii::operator<<
                    (pCVar4,*(double *)
                             (*(long *)&(this->Weight).
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar7].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl
                             + uVar5 * 8));
          pvVar1 = (this->Weight).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          bVar2 = uVar6 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar1[uVar7].
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl + 8) -
                                  *(long *)&pvVar1[uVar7].
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl >> 3);
          uVar5 = uVar6;
          uVar6 = (ulong)((int)uVar6 + 1);
        } while (bVar2);
      }
      uVar7 = (ulong)((uint)uVar7 + 1);
      uVar5 = ((long)(this->Lroots).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->Lroots).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar7 <= uVar5 && uVar5 - uVar7 != 0);
  }
  return;
}

Assistant:

void ChQuadratureTables::PrintTables() {
    GetLog() << "PrintTables: \n\n";

    for (unsigned int io = 0; io < Lroots.size(); ++io) {
        GetLog() << "\nOrder: " << Lroots[io].size() << "  at table n." << io << " with roots&weights: \n";
        for (unsigned int ir = 0; ir < Lroots[io].size(); ++ir)
            GetLog() << "  " << Lroots[io][ir];
        GetLog() << "\n";
        for (unsigned int ir = 0; ir < Weight[io].size(); ++ir)
            GetLog() << "  " << Weight[io][ir];
    }
}